

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
num_keys_in_range(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                  *this,int left,int right)

{
  bool bVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint64_t right_bitmap_data;
  int i;
  int bit_pos;
  uint64_t left_bitmap_data;
  int right_bit_pos;
  int left_bit_pos;
  uint64_t bitmap_data;
  int right_bitmap_idx;
  int left_bitmap_idx;
  int num_keys;
  int local_60;
  int local_34;
  
  bVar1 = false;
  if ((-1 < in_ESI) && (bVar1 = false, in_ESI <= in_EDX)) {
    bVar1 = in_EDX <= *(int *)(in_RDI + 0x58);
  }
  if (bVar1) {
    local_60 = in_ESI >> 6;
    iVar2 = in_EDX >> 6;
    if (local_60 == iVar2) {
      local_34 = (int)POPCOUNT((1L << ((byte)in_EDX & 0x3f)) - 1U &
                               ((1L << ((byte)in_ESI & 0x3f)) - 1U ^ 0xffffffffffffffff) &
                               *(ulong *)(*(long *)(in_RDI + 0x60) + (long)local_60 * 8));
    }
    else {
      local_34 = (int)POPCOUNT(((1L << ((byte)in_ESI & 0x3f)) - 1U ^ 0xffffffffffffffff) &
                               *(ulong *)(*(long *)(in_RDI + 0x60) + (long)local_60 * 8));
      while (local_60 = local_60 + 1, local_60 < iVar2) {
        local_34 = local_34 +
                   (int)POPCOUNT(*(undefined8 *)(*(long *)(in_RDI + 0x60) + (long)local_60 * 8));
      }
      if (iVar2 != *(int *)(in_RDI + 0x68)) {
        local_34 = local_34 +
                   (int)POPCOUNT((1L << ((byte)in_EDX & 0x3f)) - 1U &
                                 *(ulong *)(*(long *)(in_RDI + 0x60) + (long)iVar2 * 8));
      }
    }
    return local_34;
  }
  __assert_fail("left >= 0 && left <= right && right <= data_capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex_nodes.h"
                ,0x21c,
                "int alex::AlexDataNode<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::num_keys_in_range(int, int) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
               );
}

Assistant:

int num_keys_in_range(int left, int right) const {
    assert(left >= 0 && left <= right && right <= data_capacity_);
    int num_keys = 0;
    int left_bitmap_idx = left >> 6;
    int right_bitmap_idx = right >> 6;
    if (left_bitmap_idx == right_bitmap_idx) {
      uint64_t bitmap_data = bitmap_[left_bitmap_idx];
      int left_bit_pos = left - (left_bitmap_idx << 6);
      bitmap_data &= ~((1ULL << left_bit_pos) - 1);
      int right_bit_pos = right - (right_bitmap_idx << 6);
      bitmap_data &= ((1ULL << right_bit_pos) - 1);
      num_keys += _mm_popcnt_u64(bitmap_data);
    } else {
      uint64_t left_bitmap_data = bitmap_[left_bitmap_idx];
      int bit_pos = left - (left_bitmap_idx << 6);
      left_bitmap_data &= ~((1ULL << bit_pos) - 1);
      num_keys += _mm_popcnt_u64(left_bitmap_data);
      for (int i = left_bitmap_idx + 1; i < right_bitmap_idx; i++) {
        num_keys += _mm_popcnt_u64(bitmap_[i]);
      }
      if (right_bitmap_idx != bitmap_size_) {
        uint64_t right_bitmap_data = bitmap_[right_bitmap_idx];
        bit_pos = right - (right_bitmap_idx << 6);
        right_bitmap_data &= ((1ULL << bit_pos) - 1);
        num_keys += _mm_popcnt_u64(right_bitmap_data);
      }
    }
    return num_keys;
  }